

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderSubroutineTests.cpp
# Opt level: O2

string * __thiscall
gl4cts::ShaderSubroutine::Utils::getShaderStageStringFromGLEnum_abi_cxx11_
          (string *__return_storage_ptr__,Utils *this,GLenum shader_stage_glenum)

{
  TestError *this_00;
  int iVar1;
  allocator<char> local_21;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,"?",&local_21)
  ;
  iVar1 = (int)this;
  if ((((iVar1 != 0x8e88) && (iVar1 != 0x8b31)) && (iVar1 != 0x8dd9)) &&
     ((iVar1 != 0x8e87 && (iVar1 != 0x8b30)))) {
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"Unrecognized shader string",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
               ,0x50f);
    __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  std::__cxx11::string::assign((char *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::string Utils::getShaderStageStringFromGLEnum(const glw::GLenum shader_stage_glenum)
{
	std::string result = "?";

	switch (shader_stage_glenum)
	{
	case GL_FRAGMENT_SHADER:
		result = "Fragment Shader";
		break;
	case GL_GEOMETRY_SHADER:
		result = "Geometry Shader";
		break;
	case GL_TESS_CONTROL_SHADER:
		result = "Tessellation Control Shader";
		break;
	case GL_TESS_EVALUATION_SHADER:
		result = "Tessellation Evaluation Shader";
		break;
	case GL_VERTEX_SHADER:
		result = "Vertex Shader";
		break;

	default:
	{
		TCU_FAIL("Unrecognized shader string");
	}
	} /* switch (shader_stage_glenum) */

	return result;
}